

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ExtendsClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExtendsClauseSyntax,slang::parsing::Token&,slang::syntax::NameSyntax&,slang::syntax::ArgumentListSyntax*&>
          (BumpAllocator *this,Token *args,NameSyntax *args_1,ArgumentListSyntax **args_2)

{
  Token keyword;
  ExtendsClauseSyntax *this_00;
  ArgumentListSyntax **args_local_2;
  NameSyntax *args_local_1;
  Token *args_local;
  BumpAllocator *this_local;
  
  this_00 = (ExtendsClauseSyntax *)allocate(this,0x30,8);
  keyword.kind = args->kind;
  keyword._2_1_ = args->field_0x2;
  keyword.numFlags.raw = (args->numFlags).raw;
  keyword.rawLen = args->rawLen;
  keyword.info = args->info;
  slang::syntax::ExtendsClauseSyntax::ExtendsClauseSyntax(this_00,keyword,args_1,*args_2);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }